

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderBlitting.cpp
# Opt level: O1

void __thiscall glcts::GeometryShaderBlitting::deinit(GeometryShaderBlitting *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0xb8))(0x806f,0);
  (**(code **)(lVar2 + 0xd8))(0);
  (**(code **)(lVar2 + 0x78))(0x8ca9,0);
  (**(code **)(lVar2 + 0x78))(0x8ca8,0);
  if (this->m_fbo_draw_id != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->m_fbo_draw_id);
  }
  if (this->m_fbo_read_id != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->m_fbo_read_id);
  }
  if (this->m_to_draw != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_to_draw);
  }
  if (this->m_to_read != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_to_read);
  }
  if (this->m_vao_id != 0) {
    (**(code **)(lVar2 + 0x490))(1,&this->m_vao_id);
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void GeometryShaderBlitting::deinit(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset OpenGL ES state */
	gl.bindTexture(GL_TEXTURE_3D, 0);
	gl.bindVertexArray(0);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, 0);

	/* Clean up */
	if (m_fbo_draw_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_draw_id);
	}

	if (m_fbo_read_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_read_id);
	}

	if (m_to_draw != 0)
	{
		gl.deleteTextures(1, &m_to_draw);
	}

	if (m_to_read != 0)
	{
		gl.deleteTextures(1, &m_to_read);
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);
	}

	/* Release base class */
	TestCaseBase::deinit();
}